

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O3

void __thiscall sf::priv::GlxContext::setVerticalSyncEnabled(GlxContext *this,bool enabled)

{
  int iVar1;
  PFNGLXSWAPINTERVALMESAPROC *pp_Var2;
  ostream *poVar3;
  GLXDrawable GVar4;
  
  if (SF_GLAD_GLX_EXT_swap_control != 0) {
    GVar4 = this->m_pbuffer;
    if (GVar4 == 0) {
      GVar4 = this->m_window;
    }
    (*sf_glad_glXSwapIntervalEXT)(this->m_display,GVar4,SUB14(enabled,0));
    return;
  }
  if (SF_GLAD_GLX_MESA_swap_control == 0) {
    if (SF_GLAD_GLX_SGI_swap_control == 0) {
      if (setVerticalSyncEnabled(bool)::warned != '\0') {
        return;
      }
      poVar3 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Setting vertical sync not supported",0x23);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      setVerticalSyncEnabled(bool)::warned = 1;
      return;
    }
    pp_Var2 = (PFNGLXSWAPINTERVALMESAPROC *)&sf_glad_glXSwapIntervalSGI;
  }
  else {
    pp_Var2 = &sf_glad_glXSwapIntervalMESA;
  }
  iVar1 = (**pp_Var2)(SUB14(enabled,0));
  if (iVar1 == 0) {
    return;
  }
  poVar3 = err();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Setting vertical sync failed",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void GlxContext::setVerticalSyncEnabled(bool enabled)
{
    int result = 0;

    // Prioritize the EXT variant and fall back to MESA or SGI if needed
    // We use the direct pointer to the MESA entry point instead of the alias
    // because glx.h declares the entry point as an external function
    // which would require us to link in an additional library
    if (SF_GLAD_GLX_EXT_swap_control)
    {
        glXSwapIntervalEXT(m_display, m_pbuffer ? m_pbuffer : m_window, enabled ? 1 : 0);
    }
    else if (SF_GLAD_GLX_MESA_swap_control)
    {
        result = glXSwapIntervalMESA(enabled ? 1 : 0);
    }
    else if (SF_GLAD_GLX_SGI_swap_control)
    {
        result = glXSwapIntervalSGI(enabled ? 1 : 0);
    }
    else
    {
        static bool warned = false;

        if (!warned)
        {
            err() << "Setting vertical sync not supported" << std::endl;

            warned = true;
        }
    }

    if (result != 0)
        err() << "Setting vertical sync failed" << std::endl;
}